

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O2

void __thiscall Assimp::MD5::MD5Parser::ParseHeader(MD5Parser *this)

{
  char **inout;
  byte *pbVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  Logger *this_00;
  ulong uVar6;
  char *local_40 [2];
  char local_30 [16];
  
  inout = &this->buffer;
  SkipSpaces<char>(inout);
  bVar3 = TokenMatch<char>(inout,"MD5Version",10);
  if (!bVar3) {
    ReportError(this,"Invalid MD5 file: MD5Version tag has not been found");
  }
  SkipSpaces<char>(inout);
  uVar4 = strtoul10(*inout,inout);
  if (uVar4 != 10) {
    ReportError(this,"MD5 version tag is unknown (10 is expected)");
  }
  SkipLine(this);
  pcVar2 = this->buffer;
  pcVar5 = pcVar2 + 1;
  do {
    do {
      *inout = pcVar5;
      pbVar1 = (byte *)(pcVar5 + -1);
      pcVar5 = pcVar5 + 1;
    } while (0xd < *pbVar1);
  } while ((0x3401U >> (*pbVar1 & 0x1f) & 1) == 0);
  this_00 = DefaultLogger::get();
  uVar6 = (long)*inout - (long)pcVar2;
  if (0x3ff < uVar6) {
    uVar6 = 0x400;
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,pcVar2,pcVar2 + uVar6);
  Logger::info(this_00,local_40[0]);
  std::__cxx11::string::~string((string *)local_40);
  SkipSpacesAndLineEnd(this);
  return;
}

Assistant:

void MD5Parser::ParseHeader()
{
    // parse and validate the file version
    SkipSpaces();
    if (!TokenMatch(buffer,"MD5Version",10))    {
        ReportError("Invalid MD5 file: MD5Version tag has not been found");
    }
    SkipSpaces();
    unsigned int iVer = ::strtoul10(buffer,(const char**)&buffer);
    if (10 != iVer) {
        ReportError("MD5 version tag is unknown (10 is expected)");
    }
    SkipLine();

    // print the command line options to the console
    // FIX: can break the log length limit, so we need to be careful
    char* sz = buffer;
    while (!IsLineEnd( *buffer++));
    ASSIMP_LOG_INFO(std::string(sz,std::min((uintptr_t)MAX_LOG_MESSAGE_LENGTH, (uintptr_t)(buffer-sz))));
    SkipSpacesAndLineEnd();
}